

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  float fVar1;
  uint uVar2;
  pointer pFVar3;
  pointer pfVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  Logger *this_00;
  long *plVar15;
  uint *puVar16;
  long *plVar17;
  uint *puVar18;
  ulong uVar19;
  Layer *pLVar20;
  Layer *extraout_RDX;
  Layer *extraout_RDX_00;
  Layer *extraout_RDX_01;
  Layer *extraout_RDX_02;
  Layer *extraout_RDX_03;
  Layer *extraout_RDX_04;
  pointer pUVar21;
  uint uVar22;
  long lVar23;
  LWOImporter *this_01;
  ulong uVar24;
  Layer *pLVar25;
  uint uVar26;
  UVChannel *uv;
  pointer pUVar27;
  uint next;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  ulong local_d8;
  int local_cc;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar27 = (layer->mUVChannels).
            super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pUVar21 = (layer->mUVChannels).
            super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pUVar21 == pUVar27) {
    uVar26 = 0;
  }
  else {
    puVar16 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_d8 = 0;
    next = 0;
    local_cc = 0;
    uVar26 = 0;
    do {
      puVar18 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar22 = (uint)local_d8;
      if (puVar18 != puVar16) {
        uv = pUVar27 + local_d8;
        do {
          pFVar3 = (layer->mFaces).
                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pLVar20 = (Layer *)(ulong)pFVar3[*puVar18].super_aiFace.mNumIndices;
          if (pLVar20 != (Layer *)0x0) {
            this_01 = (LWOImporter *)
                      (uv->super_VMapEntry).abAssigned.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            pLVar25 = (Layer *)0x0;
LAB_004203f6:
            uVar2 = pFVar3[*puVar18].super_aiFace.mIndices[(long)pLVar25];
            uVar19 = (ulong)uVar2;
            if (((ulong)(&(this_01->super_BaseImporter)._vptr_BaseImporter)[uVar2 >> 6] >>
                 (uVar19 & 0x3f) & 1) == 0) goto LAB_0042042a;
            pfVar4 = (uv->super_VMapEntry).rawData.super__Vector_base<float,_std::allocator<float>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            fVar1 = pfVar4[uVar19 * 2];
            if ((((fVar1 == 0.0) && (!NAN(fVar1))) && (fVar1 = pfVar4[uVar19 * 2 + 1], fVar1 == 0.0)
                ) && (!NAN(fVar1))) goto LAB_0042042a;
            if (uVar26 < 8) {
              cVar8 = FindUVChannels(this_01,&surf->mColorTextures,pLVar20,uv,next);
              cVar9 = FindUVChannels(this_01,&surf->mDiffuseTextures,extraout_RDX,uv,next);
              cVar10 = FindUVChannels(this_01,&surf->mSpecularTextures,extraout_RDX_00,uv,next);
              cVar11 = FindUVChannels(this_01,&surf->mGlossinessTextures,extraout_RDX_01,uv,next);
              cVar12 = FindUVChannels(this_01,&surf->mOpacityTextures,extraout_RDX_02,uv,next);
              cVar13 = FindUVChannels(this_01,&surf->mBumpTextures,extraout_RDX_03,uv,next);
              cVar14 = FindUVChannels(this_01,&surf->mReflectionTextures,extraout_RDX_04,uv,next);
              auVar7 = _DAT_00751df0;
              auVar6 = _DAT_00751de0;
              auVar5 = _DAT_00739c00;
              if (cVar14 == '\0' &&
                  ((cVar13 == '\0' && cVar12 == '\0') &&
                  ((cVar11 == '\0' && cVar10 == '\0') && (cVar9 == '\0' && cVar8 == '\0')))) {
                uVar19 = (ulong)uVar26;
                uVar26 = uVar26 + 1;
                out[uVar19] = uVar22;
                local_cc = local_cc + 1;
              }
              else {
                uVar19 = (ulong)next;
                if ((local_cc != 0) && (next < uVar26)) {
                  uVar2 = out[uVar19];
                  lVar23 = (uVar26 - uVar19) + -1;
                  auVar28._8_4_ = (int)lVar23;
                  auVar28._0_8_ = lVar23;
                  auVar28._12_4_ = (int)((ulong)lVar23 >> 0x20);
                  auVar28 = auVar28 ^ _DAT_00739c00;
                  uVar24 = 0;
                  do {
                    auVar30._8_4_ = (int)uVar24;
                    auVar30._0_8_ = uVar24;
                    auVar30._12_4_ = (int)(uVar24 >> 0x20);
                    auVar31 = (auVar30 | auVar7) ^ auVar5;
                    iVar29 = auVar28._4_4_;
                    if ((bool)(~(iVar29 < auVar31._4_4_ ||
                                auVar28._0_4_ < auVar31._0_4_ && auVar31._4_4_ == iVar29) & 1)) {
                      out[uVar19 + uVar24 + 1] = uVar2;
                    }
                    if (auVar31._12_4_ <= auVar28._12_4_ &&
                        (auVar31._8_4_ <= auVar28._8_4_ || auVar31._12_4_ != auVar28._12_4_)) {
                      out[uVar19 + uVar24 + 2] = uVar2;
                    }
                    auVar30 = (auVar30 | auVar6) ^ auVar5;
                    iVar32 = auVar30._4_4_;
                    if (iVar32 <= iVar29 && (iVar32 != iVar29 || auVar30._0_4_ <= auVar28._0_4_)) {
                      out[uVar19 + uVar24 + 3] = uVar2;
                      out[uVar19 + uVar24 + 4] = uVar2;
                    }
                    uVar24 = uVar24 + 4;
                  } while (((uVar26 - uVar19) + 3 & 0xfffffffffffffffc) != uVar24);
                }
                uVar26 = uVar26 + 1;
                next = next + 1;
                out[uVar19] = uVar22;
              }
            }
            else {
              this_00 = DefaultLogger::get();
              std::operator+(&local_50,
                             "LWO: Maximum number of UV channels for this mesh reached. Skipping channel \'"
                             ,&(uv->super_VMapEntry).name);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
              plVar17 = plVar15 + 2;
              if ((long *)*plVar15 == plVar17) {
                local_60 = *plVar17;
                lStack_58 = plVar15[3];
                local_70 = &local_60;
              }
              else {
                local_60 = *plVar17;
                local_70 = (long *)*plVar15;
              }
              *plVar15 = (long)plVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              Logger::error(this_00,(char *)local_70);
              if (local_70 != &local_60) {
                operator_delete(local_70);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            puVar16 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar18 = puVar16 + -1;
          }
LAB_00420719:
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar16);
        pUVar27 = (layer->mUVChannels).
                  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pUVar21 = (layer->mUVChannels).
                  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_d8 = (ulong)(uVar22 + 1);
      uVar19 = ((long)pUVar21 - (long)pUVar27 >> 4) * 0x6db6db6db6db6db7;
    } while (local_d8 <= uVar19 && uVar19 - local_d8 != 0);
    if (7 < uVar26) {
      return;
    }
  }
  out[uVar26] = 0xffffffff;
  return;
LAB_0042042a:
  pLVar25 = (Layer *)((long)&(pLVar25->mTempPoints).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
  if (pLVar20 == pLVar25) goto LAB_00420719;
  goto LAB_004203f6;
}

Assistant:

void LWOImporter::FindUVChannels(LWO::Surface& surf,
    LWO::SortedRep& sorted,LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_TEXTURECOORDS])
{
    unsigned int next = 0, extra = 0, num_extra = 0;

    // Check whether we have an UV entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mUVChannels.size();++i)  {
        LWO::UVChannel& uv = layer.mUVChannels[i];

        for (LWO::SortedRep::const_iterator it = sorted.begin(); it != sorted.end(); ++it)  {

            LWO::Face& face = layer.mFaces[*it];

            for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                unsigned int idx = face.mIndices[n];

                if (uv.abAssigned[idx] && ((aiVector2D*)&uv.rawData[0])[idx] != aiVector2D()) {

                    if (extra >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {

                        ASSIMP_LOG_ERROR("LWO: Maximum number of UV channels for "
                            "this mesh reached. Skipping channel \'" + uv.name + "\'");

                    }
                    else {
                        // Search through all textures assigned to 'surf' and look for this UV channel
                        char had = 0;
                        had |= FindUVChannels(surf.mColorTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mDiffuseTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mSpecularTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mGlossinessTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mOpacityTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mBumpTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mReflectionTextures,layer,uv,next);

                        // We have a texture referencing this UV channel so we have to take special care
                        // and are willing to drop unreferenced channels in favour of it.
                        if (had != 0) {
                            if (num_extra) {

                                for (unsigned int a = next; a < std::min( extra, AI_MAX_NUMBER_OF_TEXTURECOORDS-1u ); ++a) {
                                    out[a+1] = out[a];
                                }
                            }
                            ++extra;
                            out[next++] = i;
                        }
                        // Bah ... seems not to be used at all. Push to end if enough space is available.
                        else {
                            out[extra++] = i;
                            ++num_extra;
                        }
                    }
                    it = sorted.end()-1;
                    break;
                }
            }
        }
    }
    if (extra < AI_MAX_NUMBER_OF_TEXTURECOORDS) {
        out[extra] = UINT_MAX;
    }
}